

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_sockaddr_cmp(sockaddr *sa1,sockaddr *sa2,int include_port)

{
  ushort uVar1;
  int iVar2;
  sockaddr_in6 *sin2;
  sockaddr_in6 *sin1;
  
  uVar1 = sa1->sa_family;
  iVar2 = (uint)uVar1 - (uint)sa2->sa_family;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (uVar1 == 10) {
    iVar2 = memcmp(sa1->sa_data + 6,sa2->sa_data + 6,0x10);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    if (uVar1 != 2) {
      return 1;
    }
    if (*(uint *)(sa1->sa_data + 2) < *(uint *)(sa2->sa_data + 2)) {
      return -1;
    }
    if (*(uint *)(sa2->sa_data + 2) < *(uint *)(sa1->sa_data + 2)) {
      return 1;
    }
  }
  if ((include_port == 0) ||
     (iVar2 = (uint)*(ushort *)sa1->sa_data - (uint)*(ushort *)sa2->sa_data, iVar2 == 0)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
evutil_sockaddr_cmp(const struct sockaddr *sa1, const struct sockaddr *sa2,
    int include_port)
{
	int r;
	if (0 != (r = (sa1->sa_family - sa2->sa_family)))
		return r;

	if (sa1->sa_family == AF_INET) {
		const struct sockaddr_in *sin1, *sin2;
		sin1 = (const struct sockaddr_in *)sa1;
		sin2 = (const struct sockaddr_in *)sa2;
		if (sin1->sin_addr.s_addr < sin2->sin_addr.s_addr)
			return -1;
		else if (sin1->sin_addr.s_addr > sin2->sin_addr.s_addr)
			return 1;
		else if (include_port &&
		    (r = ((int)sin1->sin_port - (int)sin2->sin_port)))
			return r;
		else
			return 0;
	}
#ifdef AF_INET6
	else if (sa1->sa_family == AF_INET6) {
		const struct sockaddr_in6 *sin1, *sin2;
		sin1 = (const struct sockaddr_in6 *)sa1;
		sin2 = (const struct sockaddr_in6 *)sa2;
		if ((r = memcmp(sin1->sin6_addr.s6_addr, sin2->sin6_addr.s6_addr, 16)))
			return r;
		else if (include_port &&
		    (r = ((int)sin1->sin6_port - (int)sin2->sin6_port)))
			return r;
		else
			return 0;
	}
#endif
	return 1;
}